

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O0

void __thiscall helics::apps::Echo::Echo(Echo *this,string_view name,FederateInfo *fedInfo)

{
  string_view appName;
  size_t in_RDX;
  App *in_RSI;
  FederateInfo *in_RDI;
  char *unaff_retaddr;
  Echo *this_00;
  
  appName._M_str = unaff_retaddr;
  appName._M_len = in_RDX;
  App::App(in_RSI,appName,in_RDI);
  (in_RDI->super_CoreFederateInfo).timeProps.
  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Echo_00a47320;
  this_00 = (Echo *)&in_RDI->defName;
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::deque
            ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x405712);
  (in_RDI->coreInitString).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(in_RDI->coreInitString).field_2 + 8) = 0;
  std::mutex::mutex((mutex *)0x40573a);
  initialSetup(this_00);
  return;
}

Assistant:

Echo::Echo(std::string_view name, const FederateInfo& fedInfo): App(name, fedInfo)
    {
        initialSetup();
    }